

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDRawBufferAsyncModificationRegister(JsValueRef instance,byte *initialModPos)

{
  anon_class_24_3_1f8f035b fn;
  byte **in_stack_ffffffffffffffb0;
  JsRef pvStack_28;
  JsErrorCode addRefResult;
  JsValueRef addRefObj;
  byte *initialModPos_local;
  JsValueRef instance_local;
  
  pvStack_28 = (JsRef)0x0;
  fn.addRefObj = &addRefObj;
  fn.instance = &stack0xffffffffffffffd8;
  fn.initialModPos = in_stack_ffffffffffffffb0;
  addRefObj = initialModPos;
  initialModPos_local = (byte *)instance;
  instance_local._4_4_ = ContextAPIWrapper<false,JsTTDRawBufferAsyncModificationRegister::__0>(fn);
  if (instance_local._4_4_ == JsNoError) {
    if (pvStack_28 == (JsRef)0x0) {
      instance_local._4_4_ = JsNoError;
    }
    else {
      instance_local._4_4_ = JsAddRef(pvStack_28,(uint *)0x0);
    }
  }
  return instance_local._4_4_;
}

Assistant:

CHAKRA_API JsTTDRawBufferAsyncModificationRegister(_In_ JsValueRef instance, _In_ byte* initialModPos)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsValueRef addRefObj = nullptr;
    JsErrorCode addRefResult = ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        if (scriptContext->IsTTDRecordModeEnabled())
        {
            TTDAssert(Js::VarIs<Js::ArrayBuffer>(instance), "Not array buffer object!!!");
            Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(instance);
            addRefObj = dstBuff;

            TTDAssert(dstBuff->GetBuffer() <= initialModPos && initialModPos < dstBuff->GetBuffer() + dstBuff->GetByteLength(), "Not array buffer object!!!");
            TTDAssert(initialModPos - dstBuff->GetBuffer() < UINT32_MAX, "This is really big!!!");
            ptrdiff_t index = initialModPos - Js::VarTo<Js::ArrayBuffer>(instance)->GetBuffer();

            scriptContext->TTDContextInfo->AddToAsyncPendingList(dstBuff, (uint32)index);

            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferAsyncModificationRegister, instance, (uint32)index);
        }

        return JsNoError;
    });

    if(addRefResult != JsNoError)
    {
        return addRefResult;
    }

    //We need to root add ref so we can find this during replay!!!
    if(addRefObj == nullptr)
    {
        return JsNoError;
    }
    else
    {
        return JsAddRef(addRefObj, nullptr);
    }
#endif
}